

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O0

int CfdAddMultisigScriptSigData
              (void *handle,void *multisig_handle,char *signature,char *related_pubkey)

{
  bool bVar1;
  undefined8 uVar2;
  char *in_RCX;
  char *in_RDX;
  long in_RSI;
  CfdException *except;
  exception *std_except;
  string pubkey_str;
  Pubkey key;
  string sig_str;
  ByteData signature_bytes;
  CfdCapiMultisigScriptSigData *data;
  int result;
  string *in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  CfdError error_code;
  allocator *paVar3;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  string local_1b0;
  allocator local_189;
  string local_188;
  Pubkey local_168;
  string local_150;
  allocator local_129;
  string *in_stack_fffffffffffffed8;
  void *in_stack_fffffffffffffee0;
  ByteData local_108;
  undefined1 local_ea;
  allocator local_e9;
  string local_e8 [32];
  CfdSourceLocation local_c8;
  long local_b0;
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [32];
  CfdSourceLocation local_80;
  allocator local_61;
  string local_60 [52];
  undefined4 local_2c;
  char *local_28;
  char *local_20;
  long local_18;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  local_2c = 0xffffffff;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"MultiScriptSig",&local_61);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  if (local_20 == (char *)0x0) {
    local_80.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_script.cpp"
                 ,0x2f);
    local_80.filename = local_80.filename + 1;
    local_80.line = 0x12e;
    local_80.funcname = "CfdAddMultisigScriptSigData";
    cfd::core::logger::warn<>(&local_80,"signature is null.");
    local_a2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"Failed to parameter. signature is null.",&local_a1);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
               error_code,in_stack_fffffffffffffde0);
    local_a2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_b0 = local_18;
  if (0x13 < *(uint *)(local_18 + 0x15c8)) {
    local_c8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_script.cpp"
                 ,0x2f);
    local_c8.filename = local_c8.filename + 1;
    local_c8.line = 0x138;
    local_c8.funcname = "CfdAddMultisigScriptSigData";
    cfd::core::logger::warn<>(&local_c8,"The number of signature has reached the upper limit.");
    local_ea = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_e8,"The number of signature has reached the upper limit.",&local_e9);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
               error_code,in_stack_fffffffffffffde0);
    local_ea = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xfffffffffffffed8,local_20,&local_129);
    cfd::core::ByteData::ByteData(&local_108,(string *)&stack0xfffffffffffffed8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_150,&local_108);
    std::__cxx11::string::copy
              ((char *)&local_150,local_b0 + 0x10 + (ulong)*(uint *)(local_b0 + 0x15c8) * 0x93,0x92)
    ;
    std::__cxx11::string::~string((string *)&local_150);
    cfd::core::ByteData::~ByteData((ByteData *)0x59691e);
  }
  bVar1 = cfd::capi::IsEmptyString(local_28);
  if (!bVar1) {
    paVar3 = &local_189;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_188,local_28,paVar3);
    cfd::core::Pubkey::Pubkey(&local_168,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_1b0,&local_168);
    std::__cxx11::string::copy
              ((char *)&local_1b0,local_b0 + 0xb8c + (ulong)*(uint *)(local_b0 + 0x15c8) * 0x83,0x82
              );
    std::__cxx11::string::~string((string *)&local_1b0);
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x596aa5);
  }
  *(int *)(local_b0 + 0x15c8) = *(int *)(local_b0 + 0x15c8) + 1;
  return 0;
}

Assistant:

int CfdAddMultisigScriptSigData(
    void* handle, void* multisig_handle, const char* signature,
    const char* related_pubkey) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(multisig_handle, kPrefixMultisigScriptSig);
    if (signature == nullptr) {
      warn(CFD_LOG_SOURCE, "signature is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null.");
    }

    CfdCapiMultisigScriptSigData* data =
        static_cast<CfdCapiMultisigScriptSigData*>(multisig_handle);
    if (data->current_index >= kMultisigMaxKeyNum) {
      warn(
          CFD_LOG_SOURCE,
          "The number of signature has reached the upper limit.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "The number of signature has reached the upper limit.");
    }

    if (!IsEmptyString(signature)) {
      ByteData signature_bytes = ByteData(std::string(signature));
      std::string sig_str = signature_bytes.GetHex();
      sig_str.copy(data->signatures[data->current_index], kSignatureHexSize);
    }

    if (!IsEmptyString(related_pubkey)) {
      Pubkey key = Pubkey(std::string(related_pubkey));
      std::string pubkey_str = key.GetHex();
      pubkey_str.copy(data->pubkeys[data->current_index], kPubkeyHexSize);
    }

    ++(data->current_index);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}